

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenSIMDReplace(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef vec,uint8_t index,
                   BinaryenExpressionRef value)

{
  SIMDReplace *this;
  
  this = (SIMDReplace *)MixedArena::allocSpace(&module->allocator,0x30,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression.type.id = 0;
  *(undefined8 *)&this->op = 0;
  this->vec = (Expression *)0x0;
  *(undefined8 *)&this->index = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression._id = SIMDReplaceId;
  this->op = op;
  this->vec = vec;
  this->index = index;
  this->value = value;
  wasm::SIMDReplace::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDReplace(BinaryenModuleRef module,
                                          BinaryenOp op,
                                          BinaryenExpressionRef vec,
                                          uint8_t index,
                                          BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDReplace(
        SIMDReplaceOp(op), (Expression*)vec, index, (Expression*)value));
}